

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImDrawCmd *in_RDI;
  ImDrawCmd draw_cmd;
  ImDrawCmd *in_stack_ffffffffffffffc0;
  ImVector<ImDrawCmd> *this_00;
  float local_38;
  float fStack_34;
  
  ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffffc0);
  this_00 = *(ImVector<ImDrawCmd> **)&in_RDI[2].ElemCount;
  local_38 = SUB84(in_RDI[2].UserCallback,0);
  if (SUB84(this_00,0) <= local_38) {
    fStack_34 = (float)((ulong)in_RDI[2].UserCallback >> 0x20);
    if ((float)((ulong)this_00 >> 0x20) <= fStack_34) goto LAB_0028d9af;
  }
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
              ,0x1c1,"AddDrawCmd","ImGui ASSERT FAILED: %s",
              "draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
             );
LAB_0028d9af:
  ImVector<ImDrawCmd>::push_back(this_00,in_RDI);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}